

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O3

void __thiscall psy::C::ParserTester::case0260(ParserTester *this)

{
  string text;
  Expectation X;
  ParseOptions parseOpts;
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined8 in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffdf8;
  pointer in_stack_fffffffffffffe00;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 in_stack_fffffffffffffe30;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe48 [64];
  _Alloc_hider in_stack_fffffffffffffe88;
  size_type in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0 [16];
  pointer in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  pointer local_140;
  vector<psy::C::Decl,_std::allocator<psy::C::Decl>_> local_138;
  pointer local_118;
  pointer local_108;
  Expectation local_100;
  SyntaxKind local_48 [28];
  
  puVar2 = &stack0xfffffffffffffe18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe08,"void x ( int ( * y ) ( z * ) , int * w ) ;","");
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe48);
  local_48[0x10] = 0x413;
  local_48[0x11] = ParameterDeclaration;
  local_48[0x12] = BasicTypeSpecifier;
  local_48[0x13] = PointerDeclarator;
  local_48[0x14] = IdentifierDeclarator;
  local_48[8] = FunctionDeclarator;
  local_48[9] = ParenthesizedDeclarator;
  local_48[10] = PointerDeclarator;
  local_48[0xb] = IdentifierDeclarator;
  local_48[0xc] = 0x419;
  local_48[0xd] = ParameterDeclaration;
  local_48[0xe] = TypedefName;
  local_48[0xf] = PointerDeclarator;
  local_48[0] = STARTof_Node;
  local_48[1] = VariableAndOrFunctionDeclaration;
  local_48[2] = VoidTypeSpecifier;
  local_48[3] = FunctionDeclarator;
  local_48[4] = IdentifierDeclarator;
  local_48[5] = ParameterSuffix;
  local_48[6] = ParameterDeclaration;
  local_48[7] = BasicTypeSpecifier;
  __l._M_len = 0x15;
  __l._M_array = local_48;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffdf0,__l,(allocator_type *)&stack0xfffffffffffffdef);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe48,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffdf0);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe28);
  text._M_string_length = in_stack_fffffffffffffe30.BF_all_;
  text._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
  text.field_2._M_allocated_capacity = in_stack_fffffffffffffe38.BF_all_;
  text.field_2._8_8_ = in_stack_fffffffffffffe40;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdf0;
  X.numE_ = (int)in_stack_fffffffffffffde8;
  X.numW_ = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdf8;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe00;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar2;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe10;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe18;
  X.continueTestDespiteOfErrors_ = (bool)(char)in_stack_fffffffffffffe20;
  X.containsAmbiguity_ = (bool)(char)((ulong)in_stack_fffffffffffffe20 >> 8);
  X._58_6_ = (int6)((ulong)in_stack_fffffffffffffe20 >> 0x10);
  X.ambiguityText_._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
  X.ambiguityText_._M_string_length = in_stack_fffffffffffffe30.BF_all_;
  X.ambiguityText_.field_2._M_allocated_capacity = in_stack_fffffffffffffe38.BF_all_;
  X.ambiguityText_.field_2._8_8_ = in_stack_fffffffffffffe40;
  X.unfinishedParse_ = (bool)in_stack_fffffffffffffe48[0];
  X._97_7_ = in_stack_fffffffffffffe48._1_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_fffffffffffffe48._8_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe48._32_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe48[0x38];
  X._153_7_ = in_stack_fffffffffffffe48._57_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffe88._M_p;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffe90;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffe98;
  parseOpts.langExts_.field_1 =
       (anon_union_8_2_2d0bec1f_for_LanguageExtensions_1)in_stack_fffffffffffffeb0;
  parseOpts.langDialect_.std_ = in_stack_fffffffffffffea0[0];
  parseOpts._1_7_ = in_stack_fffffffffffffea0._1_7_;
  parseOpts.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)in_stack_fffffffffffffea0._8_8_;
  parseOpts._24_8_ = in_stack_fffffffffffffeb8;
  parse(this,text,X,(SyntaxCategory)&stack0xfffffffffffffe08,parseOpts);
  if (local_100.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_100.declarations_);
  if (local_100.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.ambiguityText_._M_dataplus._M_p != &local_100.ambiguityText_.field_2) {
    operator_delete(local_100.ambiguityText_._M_dataplus._M_p,
                    local_100.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.descriptorsE_);
  if (in_stack_fffffffffffffdf0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffdf0,
                    (long)in_stack_fffffffffffffe00 - (long)in_stack_fffffffffffffdf0);
  }
  if (local_118 != (pointer)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_138);
  if (in_stack_fffffffffffffeb0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffeb0,(long)local_140 - (long)in_stack_fffffffffffffeb0);
  }
  if (in_stack_fffffffffffffe88._M_p != &stack0xfffffffffffffe98) {
    operator_delete(in_stack_fffffffffffffe88._M_p,in_stack_fffffffffffffe98 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe50);
  if (puVar2 != &stack0xfffffffffffffe18) {
    operator_delete(puVar2,in_stack_fffffffffffffe18 + 1);
  }
  return;
}

Assistant:

void ParserTester::case0260()
{
    parse("void x ( int ( * y ) ( z * ) , int * w ) ;",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::VariableAndOrFunctionDeclaration,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::ParenthesizedDeclarator,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::TypedefName,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::AbstractDeclarator,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::IdentifierDeclarator }));
}